

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::BrokenConnection::tryRead
          (BrokenConnection *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  String local_1d8;
  Exception local_1c0;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  BrokenConnection *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  kj::_::Debug::makeDescription<char_const(&)[7]>
            (&local_1d8,(Debug *)"\"broken\"","broken",(char (*) [7])maxBytes);
  Exception::Exception
            (&local_1c0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
             ,0x1983,&local_1d8);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,&local_1c0);
  Exception::~Exception(&local_1c0);
  String::~String(&local_1d8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    return KJ_EXCEPTION(FAILED, "broken");
  }